

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

lhcell * lhFindCell(lhpage *pPage,void *pKey,sxu32 nByte,sxu32 nHash)

{
  int iVar1;
  lhcell *pCell;
  lhash_key_cmp sCmp;
  void *local_48;
  long local_40;
  ProcCmp local_38;
  
  if ((pPage->nCell != 0) &&
     (pCell = pPage->apCell[pPage->nCellSize - 1 & nHash], pCell != (lhcell *)0x0)) {
    do {
      if ((pCell->nHash == nHash) && (pCell->nKey == nByte)) {
        if ((pCell->sKey).nByte == 0) {
          local_38 = pPage->pHash->xCmp;
          local_48 = pKey;
          local_40 = (ulong)nByte + (long)pKey;
          iVar1 = lhConsumeCellkey(pCell,lhKeyCmp,&local_48,0);
        }
        else {
          iVar1 = (*pPage->pHash->xCmp)(pKey,(pCell->sKey).pBlob,nByte);
        }
        if (iVar1 == 0) {
          return pCell;
        }
      }
      pCell = pCell->pNextCol;
    } while (pCell != (lhcell *)0x0);
  }
  return (lhcell *)0x0;
}

Assistant:

static lhcell * lhFindCell(
	lhpage *pPage,    /* Target page */
	const void *pKey, /* Lookup key */
	sxu32 nByte,      /* Key length */
	sxu32 nHash       /* Hash of the key */
	)
{
	lhcell *pEntry;
	if( pPage->nCell < 1 ){
		/* Don't bother hashing */
		return 0;
	}
	/* Point to the corresponding bucket */
	pEntry = pPage->apCell[nHash & (pPage->nCellSize - 1)];
	for(;;){
		if( pEntry == 0 ){
			break;
		}
		if( pEntry->nHash == nHash && pEntry->nKey == nByte ){
			if( SyBlobLength(&pEntry->sKey) < 1 ){
				/* Large key (> 256 KB) are not kept in-memory */
				struct lhash_key_cmp sCmp;
				int rc;
				/* Fill-in the structure */
				sCmp.zIn = (const char *)pKey;
				sCmp.zEnd = &sCmp.zIn[nByte];
				sCmp.xCmp = pPage->pHash->xCmp;
				/* Fetch the key from disk and perform the comparison */
				rc = lhConsumeCellkey(pEntry,lhKeyCmp,&sCmp,0);
				if( rc == UNQLITE_OK ){
					/* Cell found */
					return pEntry;
				}
			}else if ( pPage->pHash->xCmp(pKey,SyBlobData(&pEntry->sKey),nByte) == 0 ){
				/* Cell found */
				return pEntry;
			}
		}
		/* Point to the next entry */
		pEntry = pEntry->pNextCol;
	}
	/* No such entry */
	return 0;
}